

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

void __thiscall Jzon::Node::append(Node *this,Node *node)

{
  Data *pDVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
  local_28;
  const_iterator local_20;
  Node *local_18;
  Node *node_local;
  Node *this_local;
  
  local_18 = node;
  node_local = this;
  bVar2 = isObject(this);
  if (((bVar2) && (bVar2 = isObject(local_18), bVar2)) ||
     ((bVar2 = isArray(this), bVar2 && (bVar2 = isArray(local_18), bVar2)))) {
    detach(this);
    pDVar1 = this->data;
    local_28._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
            ::end(&this->data->children);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>const*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>
    ::__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>*>
              ((__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>const*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>
                *)&local_20,&local_28);
    __first = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
              ::begin(&local_18->data->children);
    __last = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
             ::end(&local_18->data->children);
    std::
    vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>,void>
              ((vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
                *)&pDVar1->children,local_20,
               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

void Node::append(const Node &node)
	{
		if ((isObject() && node.isObject()) || (isArray() && node.isArray()))
		{
			detach();
			data->children.insert(data->children.end(), node.data->children.begin(), node.data->children.end());
		}
	}